

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O1

void __thiscall
duckdb::DictionaryAnalyzeState::AddNewString(DictionaryAnalyzeState *this,string_t str)

{
  string_set_t *psVar1;
  __hashtable *__h;
  __node_gen_type __node_gen;
  __node_gen_type __node_gen_1;
  anon_union_16_2_67f50693_for_value local_38;
  anon_union_16_2_67f50693_for_value local_28;
  string_set_t *local_18;
  
  local_38.pointer.ptr = (char *)str.value._8_8_;
  local_38._0_8_ = str.value._0_8_;
  this->current_tuple_count = this->current_tuple_count + 1;
  this->current_unique_count = this->current_unique_count + 1;
  this->current_dict_size = this->current_dict_size + (local_38._0_8_ & 0xffffffff);
  psVar1 = &this->current_set;
  if ((local_38._0_8_ & 0xffffffff) < 0xd) {
    local_28.pointer.ptr = (char *)local_28._0_8_;
    local_28._0_8_ = psVar1;
    ::std::
    _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
              ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)psVar1,&local_38);
  }
  else {
    local_28.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringHeap::AddBlob(&this->heap,(string_t *)&local_38.pointer);
    local_18 = psVar1;
    ::std::
    _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::string_t,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
              ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)psVar1);
  }
  this->current_width = this->next_width;
  return;
}

Assistant:

void DictionaryAnalyzeState::AddNewString(string_t str) {
	current_tuple_count++;
	current_unique_count++;
	current_dict_size += str.GetSize();
	if (str.IsInlined()) {
		current_set.insert(str);
	} else {
		current_set.insert(heap.AddBlob(str));
	}
	current_width = next_width;
}